

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O3

int wrapped_lxstat64(int vers,char *path,stat *buf)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  code *UNRECOVERED_JUMPTABLE;
  curious_metadata_record_t io_args;
  undefined8 local_58;
  char *pcStack_50;
  char *local_48;
  undefined8 uStack_40;
  
  lVar3 = __tls_get_addr(&PTR_00279768);
  piVar1 = (int *)(lVar3 + 0xc);
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (code *)gotcha_get_wrappee(io_fns[8].handle);
  if ((*piVar1 == 1) && (wrappers_enabled != 0)) {
    local_48 = (char *)0x0;
    uStack_40 = 0xe;
    local_58 = 0;
    pcStack_50 = (char *)0x0;
    curious_get_filesystem(path,&pcStack_50,&local_48);
    curious_call_callbacks(4,&local_58);
    iVar2 = (*UNRECOVERED_JUMPTABLE)(vers,path,buf);
    local_58 = CONCAT44(local_58._4_4_,1);
    curious_call_callbacks(5,&local_58);
    *piVar1 = *piVar1 + -1;
    return iVar2;
  }
  *piVar1 = *piVar1 + -1;
  iVar2 = (*UNRECOVERED_JUMPTABLE)(vers,path,buf);
  return iVar2;
}

Assistant:

int wrapped_lxstat64(int vers, const char* path, struct stat* buf)
{
    WRAPPER_ENTER(xstat);

    // Get the handle for the original function
    xstat_f orig_lxstat64 = (xstat_f) gotcha_get_wrappee(io_fns[CURIOUS_XSTAT_ID].handle);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        curious_metadata_record_t io_args = {
            .call_count  = 0,
            .function_id = CURIOUS_LXSTAT64_ID,
        };

        curious_get_filesystem(path, &io_args.filesystem, &io_args.mount_point);

        curious_call_callbacks(CURIOUS_METADATA_CALLBACK, &io_args);

        // Call the original, saving the result...
        int return_val     = orig_lxstat64(vers, path, buf);
        io_args.call_count = 1;

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_METADATA_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(return_val, lxstat64);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_lxstat64(vers, path, buf), lxstat64);
    }
}